

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O2

int ON_ComponentIndexAndNumber::CompareComponent
              (ON_ComponentIndexAndNumber *a,ON_ComponentIndexAndNumber *b)

{
  int iVar1;
  
  if (a == b) {
    return 0;
  }
  if (b == (ON_ComponentIndexAndNumber *)0x0 || a == (ON_ComponentIndexAndNumber *)0x0) {
    return -1;
  }
  iVar1 = ON_COMPONENT_INDEX::Compare(&a->m_ci,&b->m_ci);
  return iVar1;
}

Assistant:

int ON_ComponentIndexAndNumber::CompareComponent(
  const ON_ComponentIndexAndNumber* a,
  const ON_ComponentIndexAndNumber* b
)
{
  if (a == b)
    return 0;
  if (nullptr == a)
    return -1; // nulls sort last
  if (nullptr == b)
    return -1; // nulls sort last
  return ON_COMPONENT_INDEX::Compare(&a->m_ci, &b->m_ci);
}